

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::CheckForInstantiations
          (TypeParameterizedTestSuiteRegistry *this)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  _Rb_tree_color _Var1;
  char *__s;
  undefined8 uVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_iterator cVar3;
  TestFactoryBase *factory;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  anon_class_112_2_99c2db9c_for_factory_ local_1e0;
  anon_class_112_2_99c2db9c_for_factory_ local_170;
  undefined1 local_100 [8];
  string message;
  string full_name;
  CodeLocation local_a0;
  _Base_ptr local_78;
  char *local_70;
  _Rb_tree_node_base *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  allocator<char> local_32;
  allocator<char> local_31;
  
  this_00 = &GetIgnoredParameterizedTestSuites_abi_cxx11_()->_M_t;
  p_Var5 = &(this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_78 = &(((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  local_68 = p_Var5;
  local_60 = this_00;
  for (p_Var4 = (this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var4 != p_Var5; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    if (*(char *)&p_Var4[3]._M_parent == '\0') {
      __k = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
             *)(p_Var4 + 1);
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(this_00,(key_type *)__k);
      if (cVar3._M_node == local_78) {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&full_name.field_2 + 8);
        std::operator+(__return_storage_ptr__,"Type parameterized test suite ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        std::operator+(&local_a0.file,__return_storage_ptr__,
                       " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run.\n\nIdeally, TYPED_TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)\n\nTo suppress this error for this test suite, insert the following line (in a non-header) in the namespace it is defined in:\n\nGTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST("
                      );
        std::operator+(&local_1e0.message,&local_a0.file,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100,&local_1e0.message,");");
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)(full_name.field_2._M_local_buf + 8));
        std::operator+(&local_1e0.message,"UninstantiatedTypeParameterizedTestSuite<",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&message.field_2 + 8),&local_1e0.message,">");
        std::__cxx11::string::~string((string *)&local_1e0);
        uVar2 = message.field_2._8_8_;
        __s = *(char **)(p_Var4 + 2);
        _Var1 = p_Var4[3]._M_color;
        std::__cxx11::string::string((string *)&local_170,(string *)local_100);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
        ::pair(&local_170.testcase,__k);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(full_name.field_2._M_local_buf + 8),"GoogleTestVerification",&local_32
                  );
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_31);
        local_a0.file._M_string_length = local_50;
        local_a0.file._M_dataplus._M_p = (pointer)&local_a0.file.field_2;
        local_70 = (char *)uVar2;
        if (local_58 == &local_48) {
          local_a0.file.field_2._8_8_ = local_48._8_8_;
        }
        else {
          local_a0.file._M_dataplus._M_p = (pointer)local_58;
        }
        local_a0.file.field_2._M_allocated_capacity._1_7_ = local_48._M_allocated_capacity._1_7_;
        local_a0.file.field_2._M_local_buf[0] = local_48._M_local_buf[0];
        local_50 = 0;
        local_48._M_local_buf[0] = '\0';
        local_a0.line = _Var1;
        local_58 = &local_48;
        factory = (TestFactoryBase *)operator_new(0x78);
        CheckForInstantiations()::$_0::__0((__0 *)&local_1e0,&local_170);
        factory->_vptr_TestFactoryBase =
             (_func_int **)
             (
             _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal34TypeParameterizedTestSuiteRegistry22CheckForInstantiationsEvE3__0EEPNS_8TestInfoEPKcS8_S8_S8_S8_iT0_E11FactoryImpl
             + 0x10);
        CheckForInstantiations()::$_0::__0((__0 *)(factory + 1),&local_1e0);
        MakeAndRegisterTestInfo
                  ((string *)(full_name.field_2._M_local_buf + 8),local_70,(char *)0x0,(char *)0x0,
                   &local_a0,
                   &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
                   (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
        CheckForInstantiations()::$_0::~__0((__0 *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)(full_name.field_2._M_local_buf + 8));
        CheckForInstantiations()::$_0::~__0((__0 *)&local_170);
        std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_100);
        p_Var5 = local_68;
        this_00 = local_60;
      }
    }
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::CheckForInstantiations() {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  for (const auto& testcase : suites_) {
    if (testcase.second.instantiated) continue;
    if (ignored.find(testcase.first) != ignored.end()) continue;

    std::string message =
        "Type parameterized test suite " + testcase.first +
        " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated "
        "via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run."
        "\n\n"
        "Ideally, TYPED_TEST_P definitions should only ever be included as "
        "part of binaries that intend to use them. (As opposed to, for "
        "example, being placed in a library that may be linked in to get "
        "other "
        "utilities.)"
        "\n\n"
        "To suppress this error for this test suite, insert the following "
        "line "
        "(in a non-header) in the namespace it is defined in:"
        "\n\n"
        "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
        testcase.first + ");";

    std::string full_name =
        "UninstantiatedTypeParameterizedTestSuite<" + testcase.first + ">";
    RegisterTest(  //
        "GoogleTestVerification", full_name.c_str(),
        nullptr,  // No type parameter.
        nullptr,  // No value parameter.
        testcase.second.code_location.file.c_str(),
        testcase.second.code_location.line, [message, testcase] {
          return new FailureTest(testcase.second.code_location, message,
                                 kErrorOnUninstantiatedTypeParameterizedTest);
        });
  }
}